

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationX.cpp
# Opt level: O1

void __thiscall
qclab::qgates::RotationX<std::complex<double>_>::apply
          (RotationX<std::complex<double>_> *this,Op op,int nbQubits,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector,int offset)

{
  int iVar1;
  double c;
  anon_class_32_3_ec8a4a28 f;
  undefined1 local_48 [32];
  
  iVar1 = (*(this->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])();
  local_48._8_8_ = (this->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.cos_;
  local_48._24_8_ = (this->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.sin_;
  local_48._0_8_ =
       (vector->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  if (op != ConjTrans) {
    local_48._24_8_ = -(double)local_48._24_8_;
  }
  local_48._16_8_ = 0;
  apply2<qclab::qgates::lambda_RotationX<std::complex<double>,double>(qclab::Op,double,double,std::complex<double>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,iVar1 + offset,(anon_class_32_3_ec8a4a28 *)local_48);
  return;
}

Assistant:

void RotationX< T >::apply( Op op , const int nbQubits ,
                              std::vector< T >& vector ,
                              const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_RotationX( op , this->cos() , this->sin() , vector.data() );
    apply2( nbQubits , qubit , f ) ;
  }